

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::Exception::Detail>::truncate
          (ArrayBuilder<kj::Exception::Detail> *this,char *__file,__off_t __length)

{
  Detail *pDVar1;
  uchar *puVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  Detail *pDVar5;
  Detail *pDVar6;
  
  pDVar1 = this->ptr;
  pDVar6 = this->pos;
  while (pDVar5 = pDVar6, pDVar1 + (long)__file < pDVar5) {
    this->pos = pDVar5 + -1;
    puVar2 = pDVar5[-1].value.ptr;
    pDVar6 = pDVar5 + -1;
    if (puVar2 != (uchar *)0x0) {
      sVar3 = pDVar5[-1].value.size_;
      pDVar5[-1].value.ptr = (uchar *)0x0;
      pDVar5[-1].value.size_ = 0;
      pAVar4 = pDVar5[-1].value.disposer;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,puVar2,1,sVar3,sVar3,0);
      pDVar6 = this->pos;
    }
  }
  return (int)pDVar5;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }